

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool CaDiCaL::parse_int_str(char *val_str,int *val)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  iVar3 = strcmp(val_str,"true");
  if (iVar3 == 0) {
    iVar3 = 1;
  }
  else {
    iVar3 = strcmp(val_str,"false");
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      uVar4 = (ulong)(*val_str == '-');
      if (9 < (int)val_str[uVar4] - 0x30U) {
        return false;
      }
      uVar5 = (ulong)((int)val_str[uVar4] - 0x30U);
      pcVar6 = val_str + uVar4 + 2;
      while( true ) {
        bVar2 = pcVar6[-1];
        uVar7 = (int)(char)bVar2 - 0x30;
        if (9 < uVar7) break;
        lVar8 = uVar5 * 10;
        if (0xccccccc < (long)uVar5) {
          lVar8 = 0x80000000;
        }
        uVar5 = 0x80000000;
        if (lVar8 <= (long)(0x80000000 - (ulong)uVar7)) {
          uVar5 = lVar8 + (ulong)uVar7;
        }
        pcVar6 = pcVar6 + 1;
      }
      uVar7 = (uint)bVar2;
      if (bVar2 != 0) {
        if (uVar7 != 0x65) {
          return false;
        }
        uVar7 = 0;
        while( true ) {
          uVar1 = (int)*pcVar6 - 0x30;
          if (9 < uVar1) break;
          pcVar6 = pcVar6 + 1;
          bVar9 = uVar7 != 0;
          uVar7 = uVar1;
          if (bVar9) {
            uVar7 = 10;
          }
        }
        if (*pcVar6 != '\0') {
          return false;
        }
      }
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        uVar5 = uVar5 * 10;
      }
      if (*val_str == '-') {
        lVar8 = -0x80000000;
        if (-0x80000000 < (long)-uVar5) {
          lVar8 = -uVar5;
        }
        iVar3 = (int)lVar8;
      }
      else {
        uVar4 = 0x7fffffff;
        if ((long)uVar5 < 0x7fffffff) {
          uVar4 = uVar5;
        }
        iVar3 = (int)uVar4;
      }
    }
  }
  *val = iVar3;
  return true;
}

Assistant:

bool parse_int_str (const char *val_str, int &val) {
  if (!strcmp (val_str, "true"))
    val = 1;
  else if (!strcmp (val_str, "false"))
    val = 0;
  else {
    const char *p = val_str;
    int sign;

    if (*p == '-')
      sign = -1, p++;
    else
      sign = 1;

    int ch;
    if (!isdigit ((ch = *p++)))
      return false;

    const int64_t bound = -(int64_t) INT_MIN;
    int64_t mantissa = ch - '0';

    while (isdigit (ch = *p++)) {
      if (bound / 10 < mantissa)
        mantissa = bound;
      else
        mantissa *= 10;
      const int digit = ch - '0';
      if (bound - digit < mantissa)
        mantissa = bound;
      else
        mantissa += digit;
    }

    int exponent = 0;
    if (ch == 'e') {
      while (isdigit ((ch = *p++)))
        exponent = exponent ? 10 : ch - '0';
      if (ch)
        return false;
    } else if (ch)
      return false;

    assert (exponent <= 10);
    int64_t val64 = mantissa;
    for (int i = 0; i < exponent; i++)
      val64 *= 10;

    if (sign < 0) {
      val64 = -val64;
      if (val64 < INT_MIN)
        val64 = INT_MIN;
    } else {
      if (val64 > INT_MAX)
        val64 = INT_MAX;
    }

    assert (INT_MIN <= val64);
    assert (val64 <= INT_MAX);

    val = val64;
  }
  return true;
}